

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

void ZopfliDeflate(ZopfliOptions *options,int btype,int final,uchar *in,size_t insize,uchar *bp,
                  uchar **out,size_t *outsize)

{
  long lVar1;
  ulong inend;
  size_t instart;
  bool bVar2;
  
  instart = 0;
  do {
    lVar1 = insize - instart;
    bVar2 = insize <= instart + 1000000;
    if (!bVar2) {
      lVar1 = 1000000;
    }
    inend = lVar1 + instart;
    ZopfliDeflatePart(options,btype,(uint)(bVar2 && final != 0),in,instart,inend,bp,out,outsize);
    instart = inend;
  } while (inend < insize);
  if (options->verbose != 0) {
    ZopfliDeflate_cold_1();
  }
  return;
}

Assistant:

void ZopfliDeflate(const ZopfliOptions* options, int btype, int final,
                   const unsigned char* in, size_t insize,
                   unsigned char* bp, unsigned char** out, size_t* outsize) {
 size_t offset = *outsize;
#if ZOPFLI_MASTER_BLOCK_SIZE == 0
  ZopfliDeflatePart(options, btype, final, in, 0, insize, bp, out, outsize);
#else
  size_t i = 0;
  do {
    int masterfinal = (i + ZOPFLI_MASTER_BLOCK_SIZE >= insize);
    int final2 = final && masterfinal;
    size_t size = masterfinal ? insize - i : ZOPFLI_MASTER_BLOCK_SIZE;
    ZopfliDeflatePart(options, btype, final2,
                      in, i, i + size, bp, out, outsize);
    i += size;
  } while (i < insize);
#endif
  if (options->verbose) {
    fprintf(stderr,
            "Original Size: %lu, Deflate: %lu, Compression: %f%% Removed\n",
            (unsigned long)insize, (unsigned long)(*outsize - offset),
            100.0 * (double)(insize - (*outsize - offset)) / (double)insize);
  }
}